

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O2

void yyml::Factory<yyml::nn::Variable<double>_>::RemoveInstance(Variable<double> *instance)

{
  _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
  *p_Var1;
  const_iterator cVar2;
  register_type *prVar3;
  long in_RDI;
  Variable<double> *local_10;
  
  if (in_RDI != 0) {
    p_Var1 = (_Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              *)registry();
    cVar2 = std::
            _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
            ::_M_find_tr<yyml::nn::Variable<double>*,void>(p_Var1,&local_10);
    prVar3 = registry();
    if ((_Rb_tree_header *)cVar2._M_node != &(prVar3->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var1 = (_Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
                *)registry();
      cVar2 = std::
              _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              ::_M_find_tr<yyml::nn::Variable<double>*,void>(p_Var1,&local_10);
      p_Var1 = (_Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
                *)registry();
      std::
      _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
      ::erase_abi_cxx11_(p_Var1,cVar2);
    }
  }
  return;
}

Assistant:

static void RemoveInstance(Type *instance) {
    if (instance != nullptr && registry().find(instance) != registry().end()) {
      auto iter = registry().find(instance);
      registry().erase(iter);
    }
  }